

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O2

void linear_close(SRC_STATE *state)

{
  void *__ptr;
  
  if (state != (SRC_STATE *)0x0) {
    __ptr = state->private_data;
    if (__ptr != (void *)0x0) {
      free(*(void **)((long)__ptr + 0x28));
      free(__ptr);
    }
    free(state);
    return;
  }
  return;
}

Assistant:

static void
linear_close (SRC_STATE *state)
{
	if (state)
	{
		LINEAR_DATA *linear = (LINEAR_DATA *) state->private_data ;
		if (linear)
		{
			if (linear->last_value)
			{
				free (linear->last_value) ;
				linear->last_value = NULL ;
			}
			free (linear) ;
			linear = NULL ;
		}
		free (state) ;
		state = NULL ;
	}
}